

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

Matrix<float,_4,_3> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::decrement<float,4,3>
          (Matrix<float,_4,_3> *__return_storage_ptr__,MatrixCaseUtils *this,
          Matrix<float,_4,_3> *mat)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Matrix<float,_4,_3> *pMVar3;
  int r;
  Vector<float,_4> *pVVar4;
  long lVar5;
  Matrix<float,_4,_3> *retVal;
  int row;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  bool bVar10;
  undefined4 uVar11;
  long lVar9;
  
  pMVar3 = __return_storage_ptr__;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  pVVar4 = (__return_storage_ptr__->m_data).m_data;
  pVVar4[2].m_data[2] = 0.0;
  pVVar4[2].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  pVVar4 = (__return_storage_ptr__->m_data).m_data;
  pVVar4[1].m_data[2] = 0.0;
  pVVar4[1].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  auVar2 = _DAT_019f34d0;
  auVar1 = _DAT_019ec5b0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  pVVar4 = (__return_storage_ptr__->m_data).m_data + 1;
  lVar5 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    auVar8 = auVar2;
    do {
      bVar10 = SUB164(auVar8 ^ auVar1,4) == -0x80000000 && SUB164(auVar8 ^ auVar1,0) < -0x7ffffffd;
      if (bVar10) {
        uVar11 = 0x3f800000;
        if (lVar5 != lVar7) {
          uVar11 = 0;
        }
        *(undefined4 *)
         ((long)((Vector<tcu::Vector<float,_4>,_3> *)(pVVar4 + -1))->m_data[0].m_data + lVar7) =
             uVar11;
      }
      if (bVar10) {
        uVar11 = 0x3f800000;
        if (lVar5 + -0x10 != lVar7) {
          uVar11 = 0;
        }
        *(undefined4 *)((long)pVVar4->m_data + lVar7) = uVar11;
      }
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0x40);
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 0x10;
    pVVar4 = (Vector<float,_4> *)(pVVar4->m_data + 1);
  } while (lVar6 != 4);
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      *(float *)((long)__return_storage_ptr__ + lVar6) = *(float *)(this + lVar6) + -1.0;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x30);
    lVar5 = lVar5 + 1;
    this = this + 4;
    __return_storage_ptr__ = (Matrix<float,_4,_3> *)((long)__return_storage_ptr__ + 4);
  } while (lVar5 != 4);
  return pMVar3;
}

Assistant:

tcu::Matrix<T, Rows, Cols> decrement (const tcu::Matrix<T, Rows, Cols>& mat)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = mat(r, c) - 1.0f;

	return retVal;
}